

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

void Gia_ManLutParams(Gia_Man_t *p,int *pnCurLuts,int *pnCurEdges,int *pnCurLevels)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  uint uVar6;
  int iVar7;
  void *__ptr;
  long lVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  
  if (((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0) &&
     (iVar7 = Tim_ManBoxNum((Tim_Man_t *)p->pManTime), iVar7 != 0)) {
    *pnCurLuts = 0;
    *pnCurEdges = 0;
    iVar7 = p->nObjs;
    if (1 < iVar7) {
      pVVar4 = p->vMapping;
      lVar8 = 1;
      do {
        if (pVVar4->nSize <= lVar8) goto LAB_0020b455;
        piVar5 = pVVar4->pArray;
        if (piVar5[lVar8] != 0) {
          *pnCurLuts = *pnCurLuts + 1;
          if (pVVar4->nSize <= lVar8) goto LAB_0020b455;
          uVar1 = piVar5[lVar8];
          if (((long)(int)uVar1 < 0) || ((uint)pVVar4->nSize <= uVar1)) goto LAB_0020b455;
          *pnCurEdges = *pnCurEdges + piVar5[(int)uVar1];
          iVar7 = p->nObjs;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < iVar7);
    }
    iVar7 = Gia_ManLutLevelWithBoxes(p);
    *pnCurLevels = iVar7;
    return;
  }
  __ptr = calloc((long)p->nObjs,4);
  *pnCurLuts = 0;
  *pnCurEdges = 0;
  iVar7 = p->nObjs;
  if (1 < iVar7) {
    pVVar4 = p->vMapping;
    uVar9 = (ulong)(uint)pVVar4->nSize;
    lVar8 = 1;
    do {
      if ((int)uVar9 <= lVar8) {
LAB_0020b455:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar5 = pVVar4->pArray;
      if (piVar5[lVar8] != 0) {
        *pnCurLuts = *pnCurLuts + 1;
        if (pVVar4->nSize <= lVar8) goto LAB_0020b455;
        uVar1 = piVar5[lVar8];
        if (((long)(int)uVar1 < 0) || ((uint)pVVar4->nSize <= uVar1)) goto LAB_0020b455;
        *pnCurEdges = *pnCurEdges + piVar5[(int)uVar1];
        uVar9 = (ulong)pVVar4->nSize;
        if ((long)uVar9 <= lVar8) goto LAB_0020b455;
        uVar1 = piVar5[lVar8];
        if (((int)uVar1 < 0) || ((uint)pVVar4->nSize <= uVar1)) goto LAB_0020b455;
        uVar2 = piVar5[uVar1];
        uVar6 = uVar2;
        if ((int)uVar2 < 1) {
          uVar6 = 0;
        }
        if ((int)uVar2 < 1) {
          iVar7 = 1;
        }
        else {
          iVar7 = 0;
          uVar11 = 0;
          do {
            iVar10 = *(int *)((long)__ptr + (long)(piVar5 + uVar1)[uVar11 + 1] * 4);
            if (iVar10 < iVar7) {
              iVar10 = iVar7;
            }
            iVar7 = iVar10;
            uVar11 = uVar11 + 1;
          } while (uVar6 != uVar11);
          iVar7 = iVar7 + 1;
        }
        *(int *)((long)__ptr + lVar8 * 4) = iVar7;
        iVar7 = p->nObjs;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar7);
  }
  *pnCurLevels = 0;
  pVVar4 = p->vCos;
  iVar7 = pVVar4->nSize;
  if (iVar7 < 1) {
LAB_0020b437:
    if (__ptr == (void *)0x0) {
      return;
    }
  }
  else {
    piVar5 = pVVar4->pArray;
    iVar10 = 0;
    lVar8 = 0;
    do {
      iVar3 = piVar5[lVar8];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) goto LAB_0020b437;
      iVar3 = *(int *)((long)__ptr +
                      (long)(int)(iVar3 - (*(uint *)(p->pObjs + iVar3) & 0x1fffffff)) * 4);
      if (iVar10 < iVar3) {
        *pnCurLevels = iVar3;
        iVar7 = pVVar4->nSize;
        iVar10 = iVar3;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar7);
  }
  free(__ptr);
  return;
}

Assistant:

void Gia_ManLutParams( Gia_Man_t * p, int * pnCurLuts, int * pnCurEdges, int * pnCurLevels )
{
    if ( p->pManTime && Tim_ManBoxNum((Tim_Man_t *)p->pManTime) )
    {
        int i;
        *pnCurLuts = 0;
        *pnCurEdges = 0;
        Gia_ManForEachLut( p, i )
        {
            (*pnCurLuts)++;
            (*pnCurEdges) += Gia_ObjLutSize(p, i);
        }
        *pnCurLevels = Gia_ManLutLevelWithBoxes( p );
    }
    else
    {
        Gia_Obj_t * pObj;
        int i, k, iFan;
        int * pLevels = ABC_CALLOC( int, Gia_ManObjNum(p) );
        *pnCurLuts = 0;
        *pnCurEdges = 0;
        Gia_ManForEachLut( p, i )
        {
            int Level = 0;
            (*pnCurLuts)++;
            (*pnCurEdges) += Gia_ObjLutSize(p, i);
            Gia_LutForEachFanin( p, i, iFan, k )
                if ( Level < pLevels[iFan] )
                    Level = pLevels[iFan];
            pLevels[i] = Level + 1;
        }
        *pnCurLevels = 0;
        Gia_ManForEachCo( p, pObj, k )
            if ( *pnCurLevels < pLevels[Gia_ObjFaninId0p(p, pObj)] )
                *pnCurLevels = pLevels[Gia_ObjFaninId0p(p, pObj)];
        ABC_FREE( pLevels );
    }
}